

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

ostream * ClipperLib::operator<<(ostream *s,IntPoint *p)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(s,"(");
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::operator<<(poVar1,")");
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const IntPoint &p)
{
  s << "(" << p.X << "," << p.Y << ")";
  return s;
}